

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch_and_reduce_algorithm.cpp
# Opt level: O2

int __thiscall branch_and_reduce_algorithm::get_max_deg_vtx(branch_and_reduce_algorithm *this)

{
  int iVar1;
  pointer pvVar2;
  pointer piVar3;
  int *piVar4;
  pointer piVar5;
  int iVar6;
  iterator __begin3;
  int *piVar7;
  long lVar8;
  int *piVar9;
  int iVar10;
  int u;
  long lVar11;
  int local_44;
  long local_40;
  
  iVar10 = -1;
  local_40 = 0;
  for (lVar11 = 0; lVar11 < this->n; lVar11 = lVar11 + 1) {
    if ((this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar11] < 0) {
      iVar6 = deg(this,(int)lVar11);
      if (iVar10 <= iVar6) {
        fast_set::clear(&this->used);
        pvVar2 = (this->adj).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        piVar3 = (this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar4 = *(pointer *)
                  ((long)&pvVar2[lVar11].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data + 8);
        piVar5 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar7 = pvVar2[lVar11].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        for (piVar9 = piVar7; piVar9 != piVar4; piVar9 = piVar9 + 1) {
          if (piVar3[*piVar9] < 0) {
            piVar5[*piVar9] = (this->used).uid;
          }
        }
        piVar3 = (this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar8 = 0;
        for (; piVar7 != piVar4; piVar7 = piVar7 + 1) {
          iVar1 = *piVar7;
          if (piVar3[iVar1] < 0) {
            for (piVar9 = pvVar2[iVar1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
                piVar9 != *(pointer *)
                           ((long)&pvVar2[iVar1].super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data + 8); piVar9 = piVar9 + 1) {
              if (piVar3[*piVar9] < 0) {
                lVar8 = lVar8 + (ulong)((this->used).used.
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_start[*piVar9] ==
                                       (this->used).uid);
              }
            }
          }
        }
        if ((iVar10 < iVar6) || ((iVar10 == iVar6 && (lVar8 < local_40)))) {
          local_44 = (int)lVar11;
          local_40 = lVar8;
          iVar10 = iVar6;
        }
      }
    }
  }
  return local_44;
}

Assistant:

int inline branch_and_reduce_algorithm::get_max_deg_vtx()
{
    int v, dv = -1;
    long long minE = 0;
    for (int u = 0; u < n; u++)
        if (x[u] < 0)
        {
            int degree = deg(u);
            if (dv > degree)
                continue;
            long long e = 0;
            used.clear();
            for (int w : adj[u])
                if (x[w] < 0)
                    used.add(w);
            for (int w : adj[u])
                if (x[w] < 0)
                {
                    for (int w2 : adj[w])
                        if (x[w2] < 0 && used.get(w2))
                            e++;
                }
            if (dv < degree || (dv == degree && minE > e))
            {
                dv = degree;
                minE = e;
                v = u;
            }
        }

    return v;
}